

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::AbstractDOMParser::entityDecl
          (AbstractDOMParser *this,DTDEntityDecl *entityDecl,bool param_2,bool param_3)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar4;
  XMLCh *pXVar5;
  XMLSize_t XVar6;
  XMLSize_t XVar7;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  XMLBuffer *pXVar8;
  XMLBuffer *pXVar9;
  long *plVar3;
  
  iVar2 = (*(this->fDocument->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x3a])
                    (this->fDocument,(entityDecl->super_XMLEntityDecl).fName,
                     CONCAT71(in_register_00000011,param_2),CONCAT71(in_register_00000009,param_3));
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  (**(code **)(*plVar3 + 0x198))(plVar3,(entityDecl->super_XMLEntityDecl).fPublicId);
  (**(code **)(*plVar3 + 0x1a0))(plVar3,(entityDecl->super_XMLEntityDecl).fSystemId);
  (**(code **)(*plVar3 + 400))(plVar3,(entityDecl->super_XMLEntityDecl).fNotationName);
  (**(code **)(*plVar3 + 0x1b8))(plVar3,(entityDecl->super_XMLEntityDecl).fBaseURI);
  iVar2 = (*(this->fDocumentType->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0x29])();
  plVar4 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x10))
                             ((long *)CONCAT44(extraout_var_00,iVar2),plVar3);
  if (plVar4 != (long *)0x0) {
    (**(code **)(*plVar4 + 0x138))(plVar4);
  }
  bVar1 = DOMDocumentTypeImpl::isIntSubsetReading(this->fDocumentType);
  if (bVar1) {
    pXVar9 = this->fInternalSubset;
    XVar7 = pXVar9->fIndex;
    XVar6 = pXVar9->fCapacity;
    pXVar8 = pXVar9;
    if (XVar7 == XVar6) {
      XMLBuffer::ensureCapacity(pXVar9,1);
      XVar7 = pXVar9->fIndex;
      pXVar8 = this->fInternalSubset;
      XVar6 = pXVar8->fCapacity;
    }
    pXVar9->fIndex = XVar7 + 1;
    pXVar9->fBuffer[XVar7] = L'<';
    XVar7 = pXVar8->fIndex;
    pXVar9 = pXVar8;
    if (XVar7 == XVar6) {
      XMLBuffer::ensureCapacity(pXVar8,1);
      XVar7 = pXVar8->fIndex;
      pXVar9 = this->fInternalSubset;
    }
    pXVar8->fIndex = XVar7 + 1;
    pXVar8->fBuffer[XVar7] = L'!';
    XMLBuffer::append(pXVar9,L"ENTITY");
    pXVar9 = this->fInternalSubset;
    XVar7 = pXVar9->fIndex;
    pXVar8 = pXVar9;
    if (XVar7 == pXVar9->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar9,1);
      XVar7 = pXVar9->fIndex;
      pXVar8 = this->fInternalSubset;
    }
    pXVar9->fIndex = XVar7 + 1;
    pXVar9->fBuffer[XVar7] = L' ';
    XMLBuffer::append(pXVar8,(entityDecl->super_XMLEntityDecl).fName);
    pXVar5 = (XMLCh *)(**(code **)(*plVar3 + 0x140))(plVar3);
    if (pXVar5 != (XMLCh *)0x0) {
      pXVar9 = this->fInternalSubset;
      XVar7 = pXVar9->fIndex;
      pXVar8 = pXVar9;
      if (XVar7 == pXVar9->fCapacity) {
        XMLBuffer::ensureCapacity(pXVar9,1);
        XVar7 = pXVar9->fIndex;
        pXVar8 = this->fInternalSubset;
      }
      pXVar9->fIndex = XVar7 + 1;
      pXVar9->fBuffer[XVar7] = L' ';
      XMLBuffer::append(pXVar8,(XMLCh *)XMLUni::fgPubIDString);
      pXVar9 = this->fInternalSubset;
      XVar7 = pXVar9->fIndex;
      XVar6 = pXVar9->fCapacity;
      pXVar8 = pXVar9;
      if (XVar7 == XVar6) {
        XMLBuffer::ensureCapacity(pXVar9,1);
        XVar7 = pXVar9->fIndex;
        pXVar8 = this->fInternalSubset;
        XVar6 = pXVar8->fCapacity;
      }
      pXVar9->fIndex = XVar7 + 1;
      pXVar9->fBuffer[XVar7] = L' ';
      XVar7 = pXVar8->fIndex;
      pXVar9 = pXVar8;
      if (XVar7 == XVar6) {
        XMLBuffer::ensureCapacity(pXVar8,1);
        XVar7 = pXVar8->fIndex;
        pXVar9 = this->fInternalSubset;
      }
      pXVar8->fIndex = XVar7 + 1;
      pXVar8->fBuffer[XVar7] = L'\"';
      XMLBuffer::append(pXVar9,pXVar5);
      pXVar9 = this->fInternalSubset;
      XVar7 = pXVar9->fIndex;
      if (XVar7 == pXVar9->fCapacity) {
        XMLBuffer::ensureCapacity(pXVar9,1);
        XVar7 = pXVar9->fIndex;
      }
      pXVar9->fIndex = XVar7 + 1;
      pXVar9->fBuffer[XVar7] = L'\"';
    }
    pXVar5 = (XMLCh *)(**(code **)(*plVar3 + 0x148))(plVar3);
    if (pXVar5 != (XMLCh *)0x0) {
      pXVar9 = this->fInternalSubset;
      XVar7 = pXVar9->fIndex;
      pXVar8 = pXVar9;
      if (XVar7 == pXVar9->fCapacity) {
        XMLBuffer::ensureCapacity(pXVar9,1);
        XVar7 = pXVar9->fIndex;
        pXVar8 = this->fInternalSubset;
      }
      pXVar9->fIndex = XVar7 + 1;
      pXVar9->fBuffer[XVar7] = L' ';
      XMLBuffer::append(pXVar8,(XMLCh *)XMLUni::fgSysIDString);
      pXVar9 = this->fInternalSubset;
      XVar7 = pXVar9->fIndex;
      XVar6 = pXVar9->fCapacity;
      pXVar8 = pXVar9;
      if (XVar7 == XVar6) {
        XMLBuffer::ensureCapacity(pXVar9,1);
        XVar7 = pXVar9->fIndex;
        pXVar8 = this->fInternalSubset;
        XVar6 = pXVar8->fCapacity;
      }
      pXVar9->fIndex = XVar7 + 1;
      pXVar9->fBuffer[XVar7] = L' ';
      XVar7 = pXVar8->fIndex;
      pXVar9 = pXVar8;
      if (XVar7 == XVar6) {
        XMLBuffer::ensureCapacity(pXVar8,1);
        XVar7 = pXVar8->fIndex;
        pXVar9 = this->fInternalSubset;
      }
      pXVar8->fIndex = XVar7 + 1;
      pXVar8->fBuffer[XVar7] = L'\"';
      XMLBuffer::append(pXVar9,pXVar5);
      pXVar9 = this->fInternalSubset;
      XVar7 = pXVar9->fIndex;
      if (XVar7 == pXVar9->fCapacity) {
        XMLBuffer::ensureCapacity(pXVar9,1);
        XVar7 = pXVar9->fIndex;
      }
      pXVar9->fIndex = XVar7 + 1;
      pXVar9->fBuffer[XVar7] = L'\"';
    }
    pXVar5 = (XMLCh *)(**(code **)(*plVar3 + 0x150))(plVar3);
    if (pXVar5 != (XMLCh *)0x0) {
      pXVar9 = this->fInternalSubset;
      XVar7 = pXVar9->fIndex;
      pXVar8 = pXVar9;
      if (XVar7 == pXVar9->fCapacity) {
        XMLBuffer::ensureCapacity(pXVar9,1);
        XVar7 = pXVar9->fIndex;
        pXVar8 = this->fInternalSubset;
      }
      pXVar9->fIndex = XVar7 + 1;
      pXVar9->fBuffer[XVar7] = L' ';
      XMLBuffer::append(pXVar8,(XMLCh *)XMLUni::fgNDATAString);
      pXVar9 = this->fInternalSubset;
      XVar7 = pXVar9->fIndex;
      pXVar8 = pXVar9;
      if (XVar7 == pXVar9->fCapacity) {
        XMLBuffer::ensureCapacity(pXVar9,1);
        XVar7 = pXVar9->fIndex;
        pXVar8 = this->fInternalSubset;
      }
      pXVar9->fIndex = XVar7 + 1;
      pXVar9->fBuffer[XVar7] = L' ';
      XMLBuffer::append(pXVar8,pXVar5);
    }
    pXVar5 = (entityDecl->super_XMLEntityDecl).fValue;
    pXVar9 = this->fInternalSubset;
    if (pXVar5 != (XMLCh *)0x0) {
      XVar7 = pXVar9->fIndex;
      XVar6 = pXVar9->fCapacity;
      pXVar8 = pXVar9;
      if (XVar7 == XVar6) {
        XMLBuffer::ensureCapacity(pXVar9,1);
        XVar7 = pXVar9->fIndex;
        pXVar8 = this->fInternalSubset;
        XVar6 = pXVar8->fCapacity;
      }
      pXVar9->fIndex = XVar7 + 1;
      pXVar9->fBuffer[XVar7] = L' ';
      XVar7 = pXVar8->fIndex;
      pXVar9 = pXVar8;
      if (XVar7 == XVar6) {
        XMLBuffer::ensureCapacity(pXVar8,1);
        XVar7 = pXVar8->fIndex;
        pXVar9 = this->fInternalSubset;
      }
      pXVar8->fIndex = XVar7 + 1;
      pXVar8->fBuffer[XVar7] = L'\"';
      XMLBuffer::append(pXVar9,pXVar5);
      pXVar8 = this->fInternalSubset;
      XVar7 = pXVar8->fIndex;
      pXVar9 = pXVar8;
      if (XVar7 == pXVar8->fCapacity) {
        XMLBuffer::ensureCapacity(pXVar8,1);
        XVar7 = pXVar8->fIndex;
        pXVar9 = this->fInternalSubset;
      }
      pXVar8->fIndex = XVar7 + 1;
      pXVar8->fBuffer[XVar7] = L'\"';
    }
    XVar7 = pXVar9->fIndex;
    if (XVar7 == pXVar9->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar9,1);
      XVar7 = pXVar9->fIndex;
    }
    pXVar9->fIndex = XVar7 + 1;
    pXVar9->fBuffer[XVar7] = L'>';
  }
  return;
}

Assistant:

void AbstractDOMParser::entityDecl
(
    const   DTDEntityDecl&  entityDecl
    , const bool
    , const bool
)
{
    DOMEntityImpl* entity = (DOMEntityImpl *) fDocument->createEntity(entityDecl.getName());

    entity->setPublicId(entityDecl.getPublicId());
    entity->setSystemId(entityDecl.getSystemId());
    entity->setNotationName(entityDecl.getNotationName());
    entity->setBaseURI(entityDecl.getBaseURI());

    DOMEntityImpl *previousDef = (DOMEntityImpl *)
	    fDocumentType->getEntities()->setNamedItem( entity );

    if (previousDef)
        previousDef->release();

    if (fDocumentType->isIntSubsetReading())
    {
        //add thes chars to internalSubset variable
        fInternalSubset.append(chOpenAngle);
        fInternalSubset.append(chBang);
        fInternalSubset.append(XMLUni::fgEntityString);
        fInternalSubset.append(chSpace);

        fInternalSubset.append(entityDecl.getName());

        const XMLCh* id = entity->getPublicId();
        if (id != 0) {
            fInternalSubset.append(chSpace);
            fInternalSubset.append(XMLUni::fgPubIDString);
            fInternalSubset.append(chSpace);
            fInternalSubset.append(chDoubleQuote);
            fInternalSubset.append(id);
            fInternalSubset.append(chDoubleQuote);
        }
        id = entity->getSystemId();
        if (id != 0) {
            fInternalSubset.append(chSpace);
            fInternalSubset.append(XMLUni::fgSysIDString);
            fInternalSubset.append(chSpace);
            fInternalSubset.append(chDoubleQuote);
            fInternalSubset.append(id);
            fInternalSubset.append(chDoubleQuote);

        }
        id = entity->getNotationName();
        if (id != 0) {
            fInternalSubset.append(chSpace);
            fInternalSubset.append(XMLUni::fgNDATAString);
            fInternalSubset.append(chSpace);
            fInternalSubset.append(id);
        }
        id = entityDecl.getValue();
        if (id !=0) {
            fInternalSubset.append(chSpace);
            fInternalSubset.append(chDoubleQuote);
            fInternalSubset.append(id);
            fInternalSubset.append(chDoubleQuote);
        }

        fInternalSubset.append(chCloseAngle);
    }

}